

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicyULT.cpp
# Opt level: O0

void __thiscall CTestXe_LPGCachePolicy::CheckVirtualL3CachePolicy(CTestXe_LPGCachePolicy *this)

{
  bool bVar1;
  undefined8 uVar2;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_2b0;
  Message local_2a8;
  uint local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_13;
  Message local_280;
  uint local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_12;
  Message local_258;
  uint local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  ushort local_222;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_10;
  Message local_208;
  ushort local_1fa;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_9;
  Message local_1e0;
  uint local_1d8 [2];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  Message local_1b8;
  uint local_1b0 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  uint local_188 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  Message local_168;
  uint local_160 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  uint local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  ushort local_e6;
  unsigned_short local_e4 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  ushort local_be;
  unsigned_short local_bc [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0 [3];
  ushort local_86;
  unsigned_short local_84 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  uint32_t StartMocsIdx;
  GMM_CACHE_POLICY_TBL_ELEMENT Mocs_1;
  uint32_t AssignedMocsIdx;
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t Usage;
  GMM_CACHE_POLICY_TBL_ELEMENT Mocs;
  uint32_t MocsIndex;
  uint32_t L3_UNCACHEABLE;
  uint32_t L3_WB_CACHEABLE;
  uint32_t L4_UNCACHEABLE;
  uint32_t L4_WT_CACHEABLE;
  uint32_t L4_WB_CACHEABLE;
  CTestXe_LPGCachePolicy *this_local;
  
  L4_UNCACHEABLE = 0;
  L3_WB_CACHEABLE = 1;
  L3_UNCACHEABLE = 3;
  MocsIndex = 3;
  Mocs.L3 = (anon_union_2_3_6e525fdd_for_L3)0x1;
  Mocs.HDCL1 = '\0';
  Mocs._7_1_ = 0;
  _L4_WT_CACHEABLE = this;
  for (Mocs.LeCC.DwordValue = 0; Mocs.LeCC.DwordValue < 0x10;
      Mocs.LeCC.DwordValue = Mocs.LeCC.DwordValue + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
              (CommonULT::pGmmULTClientContext,Mocs.LeCC.DwordValue);
  }
  for (ClientRequest.IsOverridenByRegkey = 0; ClientRequest.IsOverridenByRegkey < 0x11e;
      ClientRequest.IsOverridenByRegkey = ClientRequest.IsOverridenByRegkey + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (&Mocs_1.L3,CommonULT::pGmmULTClientContext,ClientRequest.IsOverridenByRegkey);
    Mocs_1.LeCC.DwordValue = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    uVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
                      (CommonULT::pGmmULTClientContext,Mocs_1.LeCC.DwordValue);
    gtest_ar.message_.ptr_._0_4_ = 0;
    local_84[0] = 0;
    local_84[1] = 0;
    StartMocsIdx._0_2_ = (ushort)((ulong)uVar2 >> 0x20);
    local_86 = (ushort)StartMocsIdx & 1;
    unique0x10001765 = uVar2;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_80,"0",(int *)"Mocs.L3.ESC",local_84,&local_86);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(local_a0);
      pMVar3 = testing::Message::operator<<(local_a0,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [18])": ESC is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    local_bc[0] = 0;
    local_bc[1] = 0;
    local_be = (ushort)StartMocsIdx >> 1 & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_b8,"0",(int *)"Mocs.L3.SCC",local_bc,&local_be);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pMVar3 = testing::Message::operator<<(&local_c8,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [18])": SCC is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    local_e4[0] = 0;
    local_e4[1] = 0;
    local_e6 = (ushort)StartMocsIdx._1_1_;
    testing::internal::EqHelper<true>::Compare<int,unsigned_short>
              ((char *)local_e0,"0",(int *)"Mocs.L3.Reserved",local_e4,&local_e6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pMVar3 = testing::Message::operator<<(&local_f0,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [29])0x228425);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9d,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    local_10c = 0x10;
    testing::internal::CmpHelperGT<int,unsigned_int>
              ((internal *)local_108,"(16)","AssignedMocsIdx",&local_10c,(uint *)&Mocs_1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pMVar3 = testing::Message::operator<<(&local_118,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<
                         (pMVar3,(char (*) [43])": MOCS Index greater than MAX allowed (16)");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    local_138[1] = 0;
    local_138[0] = gtest_ar.message_.ptr_._4_4_ & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_130,"0",(int *)"Mocs.LeCC.Xe_LPG.Reserved0",local_138 + 1,local_138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pMVar3 = testing::Message::operator<<(&local_140,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [31])": : Reserved field is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    local_160[1] = 0;
    local_160[0] = gtest_ar.message_.ptr_._4_4_ >> 4 & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_158,"0",(int *)"Mocs.LeCC.Xe_LPG.Reserved1",local_160 + 1,local_160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pMVar3 = testing::Message::operator<<(&local_168,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [31])": : Reserved field is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    local_188[1] = 0;
    local_188[0] = gtest_ar.message_.ptr_._4_4_ >> 6 & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_180,"0",(int *)"Mocs.LeCC.Xe_LPG.Reserved2",local_188 + 1,local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pMVar3 = testing::Message::operator<<(&local_190,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [31])": : Reserved field is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa2,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    local_1b0[1] = 0;
    local_1b0[0] = gtest_ar.message_.ptr_._4_4_ >> 9;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_1a8,"0",(int *)"Mocs.LeCC.Xe_LPG.Reserved3",local_1b0 + 1,local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pMVar3 = testing::Message::operator<<(&local_1b8,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [31])": : Reserved field is non-zero");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    local_1d8[1] = 1;
    local_1d8[0] = gtest_ar.message_.ptr_._4_4_ >> 8 & 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_1d0,"1","Mocs.LeCC.Xe_LPG.igPAT",(int *)(local_1d8 + 1),
               local_1d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pMVar3 = testing::Message::operator<<(&local_1e0,(char (*) [8])"Usage# ");
      pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
      pMVar3 = testing::Message::operator<<
                         (pMVar3,(char (*) [38])": Incorrect igPAT cachebility setting");
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
    if ((((ulong)(uint)ClientRequest._4_4_ << 0x20) >> 0x30 & 3) == 0) {
      local_222 = (ushort)StartMocsIdx >> 4 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_short>
                ((EqHelper<false> *)local_220,"L3_UNCACHEABLE","Mocs.L3.Cacheability",
                 (uint *)&Mocs.L3.UshortValue,&local_222);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pMVar3 = testing::Message::operator<<(&local_230,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [35])": Incorrect L3 cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xaf,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    }
    else {
      local_1fa = (ushort)StartMocsIdx >> 4 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_short>
                ((EqHelper<false> *)local_1f8,"L3_WB_CACHEABLE","Mocs.L3.Cacheability",&MocsIndex,
                 &local_1fa);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
      if (!bVar1) {
        testing::Message::Message(&local_208);
        pMVar3 = testing::Message::operator<<(&local_208,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [35])": Incorrect L3 cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xab,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_208);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    }
    if ((ClientRequest._4_4_ & 3) == 1) {
      local_24c = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_248,"L4_WB_CACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",
                 &L4_UNCACHEABLE,&local_24c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pMVar3 = testing::Message::operator<<(&local_258,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [37])": Incorrect L4CC cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xb7,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
    }
    else if ((ClientRequest._4_4_ & 3) == 2) {
      local_274 = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_270,"L4_WT_CACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",
                 &L3_WB_CACHEABLE,&local_274);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        pMVar3 = testing::Message::operator<<(&local_280,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [37])": Incorrect L4CC cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xbc,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,pMVar3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    }
    else {
      local_29c = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_298,"L4_UNCACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",
                 &L3_UNCACHEABLE,&local_29c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
      if (!bVar1) {
        testing::Message::Message(&local_2a8);
        pMVar3 = testing::Message::operator<<(&local_2a8,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,&ClientRequest.IsOverridenByRegkey);
        pMVar3 = testing::Message::operator<<
                           (pMVar3,(char (*) [37])": Incorrect L4CC cachebility setting");
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xc0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2b0,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_2b0);
        testing::Message::~Message(&local_2a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    }
  }
  return;
}

Assistant:

void CTestXe_LPGCachePolicy::CheckVirtualL3CachePolicy()
{
    const uint32_t L4_WB_CACHEABLE = 0x0;
    const uint32_t L4_WT_CACHEABLE = 0x1;
    const uint32_t L4_UNCACHEABLE  = 0x3;

    const uint32_t L3_WB_CACHEABLE = 0x3;
    const uint32_t L3_UNCACHEABLE  = 0x1;

    for(uint32_t MocsIndex = 0; MocsIndex < GMM_XE_NUM_MOCS_ENTRIES; MocsIndex++)
    {
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs = pGmmULTClientContext->GetCachePolicyTlbElement(MocsIndex);
        //printf("Xe LPG: MocsIndex: %d --> Global Index: [0x%x]\n", MocsIndex, Mocs.LeCC.Xe_LPG.DwordValue);
        //printf("Xe LPG: MocsIndex: %d --> L3 Index: [0x%x]\n", MocsIndex, Mocs.L3.UshortValue);
    }

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                AssignedMocsIdx = ClientRequest.MemoryObjectOverride.XE_LPG.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);
        uint32_t                     StartMocsIdx    = 0;

        EXPECT_EQ(0, Mocs.L3.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.L3.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.L3.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";
        // Check if Mocs Index is not greater than GMM_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_XE_NUM_MOCS_ENTRIES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (16)";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved0) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved1) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved2) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved3) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(1, Mocs.LeCC.Xe_LPG.igPAT) << "Usage# " << Usage << ": Incorrect igPAT cachebility setting";

        //printf("Xe LPG: Usage: %d --> Index: [%d]\n", Usage, AssignedMocsIdx);

        //L3
        if (ClientRequest.L3CC)
        {
            EXPECT_EQ(L3_WB_CACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
        else
        {
            EXPECT_EQ(L3_UNCACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }

        // L4 cache memory- 0: UC, 1:WB, 2: WT
        switch(ClientRequest.L4CC)
        {
            case 0x1:
            {
                EXPECT_EQ(L4_WB_CACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
                break;
            }
            case 0x2:
            {
                EXPECT_EQ(L4_WT_CACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
                break;
            }
            default:
                EXPECT_EQ(L4_UNCACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
        }
    }
}